

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_modifier(lysp_yin_ctx *ctx,void *parent,char **pat,lysp_ext_instance **exts)

{
  int iVar1;
  size_t sVar2;
  ly_ctx *local_70;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [1];
  char *modified_val;
  char *temp_val;
  lysp_ext_instance **exts_local;
  char **pat_local;
  void *parent_local;
  lysp_yin_ctx *ctx_local;
  
  ret___1 = LY_STMT_EXTENSION_INSTANCE;
  ret__ = 0;
  subelems[0].type = LY_STMT_NONE;
  subelems[0]._4_4_ = 0;
  subelems[0].dest = (void *)0x0;
  temp_val = (char *)exts;
  exts_local = (lysp_ext_instance **)pat;
  pat_local = (char **)parent;
  parent_local = ctx;
  if (**pat != '\x06') {
    __assert_fail("**pat == 0x06",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0x3c1,
                  "LY_ERR yin_parse_modifier(struct lysp_yin_ctx *, const void *, const char **, struct lysp_ext_instance **)"
                 );
  }
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute((lysp_yin_ctx *)parent_local,YIN_ARG_VALUE,&modified_val,Y_STR_ARG,
                               LY_STMT_MODIFIER), ctx_local._4_4_ == LY_SUCCESS)) {
    iVar1 = strcmp(modified_val,"invert-match");
    if (iVar1 == 0) {
      lydict_remove((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),modified_val);
      sVar2 = strlen((char *)*exts_local);
      subelems[0]._16_8_ = malloc(sVar2 + 1);
      if ((char *)subelems[0]._16_8_ == (char *)0x0) {
        ly_log((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","yin_parse_modifier");
        ctx_local._4_4_ = LY_EMEM;
      }
      else {
        strcpy((char *)subelems[0]._16_8_,(char *)*exts_local);
        lydict_remove((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),(char *)*exts_local);
        *(undefined1 *)subelems[0]._16_8_ = 0x15;
        ctx_local._4_4_ =
             lydict_insert_zc((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),
                              (char *)subelems[0]._16_8_,(char **)exts_local);
        if ((ctx_local._4_4_ == LY_SUCCESS) &&
           (ctx_local._4_4_ =
                 yin_parse_content((lysp_yin_ctx *)parent_local,(yin_subelement *)&ret___1,1,
                                   pat_local,LY_STMT_MODIFIER,(char **)0x0,
                                   (lysp_ext_instance **)temp_val), ctx_local._4_4_ == LY_SUCCESS))
        {
          ctx_local._4_4_ = LY_SUCCESS;
        }
      }
    }
    else {
      if (parent_local == (void *)0x0) {
        local_70 = (ly_ctx *)0x0;
      }
      else {
        local_70 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)((long)parent_local + 0x38) + 8) +
                      (ulong)(*(int *)(*(long *)((long)parent_local + 0x38) + 4) - 1) * 8);
      }
      ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YIN,
              "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Only valid value is \"%s\"."
              ,modified_val,"value","modifier","invert-match");
      lydict_remove((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),modified_val);
      ctx_local._4_4_ = LY_EVALID;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_modifier(struct lysp_yin_ctx *ctx, const void *parent, const char **pat, struct lysp_ext_instance **exts)
{
    const char *temp_val;
    char *modified_val;
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    assert(**pat == 0x06);

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_MODIFIER));
    if (strcmp(temp_val, "invert-match") != 0) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS1, temp_val, "value",
                "modifier", "invert-match");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    /* allocate new value */
    modified_val = malloc(strlen(*pat) + 1);
    LY_CHECK_ERR_RET(!modified_val, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
    strcpy(modified_val, *pat);
    lydict_remove(ctx->xmlctx->ctx, *pat);

    /* modify the new value */
    modified_val[0] = LYSP_RESTR_PATTERN_NACK;
    LY_CHECK_RET(lydict_insert_zc(ctx->xmlctx->ctx, modified_val, pat));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_MODIFIER, NULL, exts));

    return LY_SUCCESS;
}